

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduling_tests.hpp
# Opt level: O3

void test_multiple_unit_tasks(void)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  undefined8 uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  uint uVar3;
  uint uVar4;
  long *plVar5;
  helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
  *phVar6;
  ulong uVar7;
  size_type *psVar8;
  task_handle *h;
  ulong uVar9;
  task_handle *this_00;
  uint __len;
  test __t;
  string __str;
  vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_> handles;
  test local_99;
  string local_98;
  long *local_78 [2];
  long local_68 [2];
  undefined8 local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_> local_48;
  
  test::test(&local_99,"test_multiple_unit_tasks");
  std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>::vector
            (&local_48,(long)gTaskCount,(allocator_type *)&local_98);
  this_00 = local_48.super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (0 < gTaskCount) {
    uVar9 = 0;
    do {
      __len = 1;
      if (9 < uVar9) {
        uVar3 = 4;
        uVar7 = uVar9;
        do {
          __len = uVar3;
          uVar4 = (uint)uVar7;
          if (uVar4 < 100) {
            __len = __len - 2;
            goto LAB_00169380;
          }
          if (uVar4 < 1000) {
            __len = __len - 1;
            goto LAB_00169380;
          }
          if (uVar4 < 10000) goto LAB_00169380;
          uVar7 = (uVar7 & 0xffffffff) / 10000;
          uVar3 = __len + 4;
        } while (99999 < uVar4);
        __len = __len + 1;
      }
LAB_00169380:
      local_78[0] = local_68;
      std::__cxx11::string::_M_construct((ulong)local_78,(char)__len);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_78[0],__len,(uint)uVar9);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)local_78,0,(char *)0x0,0x1c717e);
      psVar8 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_98.field_2._M_allocated_capacity = *psVar8;
        local_98.field_2._8_8_ = plVar5[3];
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      }
      else {
        local_98.field_2._M_allocated_capacity = *psVar8;
        local_98._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_98._M_string_length = plVar5[1];
      *plVar5 = (long)psVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      oqpi::
      helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
      ::
      schedule_task<(oqpi::task_type)1,oqpi::context_container<oqpi::task_base,timer_task_context>,unsigned_long(&)(unsigned_long),unsigned_long_long_const&>
                ((helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
                  *)&local_58,&local_98,normal,fibonacci,&gValue);
      p_Var2 = p_Stack_50;
      uVar1 = local_58;
      phVar6 = (helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
                *)(local_48.
                   super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>._M_impl
                   .super__Vector_impl_data._M_start + uVar9);
      if (phVar6 != (helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
                     *)&local_58) {
        local_58 = 0;
        p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(phVar6 + 8);
        *(undefined8 *)phVar6 = uVar1;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(phVar6 + 8) = p_Var2;
        if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
        }
      }
      if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if (local_78[0] != local_68) {
        operator_delete(local_78[0],local_68[0] + 1);
      }
      uVar9 = uVar9 + 1;
      this_00 = local_48.super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while ((long)uVar9 < (long)gTaskCount);
  }
  for (; this_00 !=
         local_48.super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>._M_impl.
         super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
    oqpi::task_handle::validate(this_00);
    (*((this_00->spTask_).super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_task_base[4])();
  }
  std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>::~vector(&local_48);
  test::~test(&local_99);
  return;
}

Assistant:

void test_multiple_unit_tasks()
{
    TEST_FUNC;

    std::vector<oqpi::task_handle> handles(gTaskCount);
    for (auto i = 0; i < gTaskCount; ++i)
    {
        handles[i] = oqpi_tk::schedule_task("Fibonacci_" + std::to_string(i), fibonacci, gValue);
    }
    for (auto &h : handles)
    {
        h.wait();
    }
}